

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processes.cxx
# Opt level: O3

void __thiscall Regular::prepareNextState(Regular *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  
  paVar1 = &(this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
            super_Physical.physicalUnit.sUnitSymbol.field_2;
  paVar1->_M_allocated_capacity = paVar1->_M_allocated_capacity - 1;
  sVar2 = paVar1->_M_allocated_capacity;
  if (sVar2 == 0) {
    *(double *)
     ((this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
      super_Physical.physicalUnit.siUnits + 3) =
         *(double *)
          ((this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
           super_Physical.physicalUnit.siUnits + 3) + 1.0;
    (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
    super_Physical.physicalUnit.sUnitSymbol.field_2._M_allocated_capacity =
         (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
         super_Physical.physicalUnit.sUnitSymbol._M_string_length;
  }
  *(bool *)((long)&(this->super_StochasticEventGenerator).super_StochasticVariable.
                   super_StochasticProcess.super_Physical.physicalUnit.sUnitSymbol._M_dataplus + 1)
       = sVar2 == 0;
  *(undefined1 *)
   ((this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
    super_Physical.physicalUnit.siUnits + 5) = 1;
  return;
}

Assistant:

void Regular::prepareNextState()
{
	regularCount--;
	if (!regularCount) {
		stochNextValue += 1.0;
        eventNextValue = true;
		regularCount = regularInterval;
	}
	else
        eventNextValue = false;
	stochNextStateIsPrepared = true;
}